

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

string_view __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::type(Scope<hgdb::json::VarStmt> *this)

{
  bool bVar1;
  char *__str;
  Scope<hgdb::json::VarStmt> *this_local;
  
  bVar1 = std::
          vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
          ::empty(&(this->super_ScopeBase).scopes_);
  __str = "block";
  if (bVar1) {
    __str = "none";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__str);
  return _this_local;
}

Assistant:

[[nodiscard]] std::string_view type() const override {
        return scopes_.empty() ? "none" : "block";
    }